

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster(FlatBufferBuilder *_fbb,MonsterT *_o,rehasher_function_t *_rehasher)

{
  float testf;
  float testf2;
  float testf3;
  Color color;
  Any test_type;
  bool testbool;
  AnyUniqueAliases any_unique_type;
  AnyAmbiguousAliases any_ambiguous_type;
  Race signed_enum;
  int16_t mana;
  int16_t hp;
  int32_t testhashs32_fnv1;
  uint32_t testhashu32_fnv1;
  int32_t testhashs32_fnv1a;
  MonsterT *_o_00;
  StatT *_o_01;
  Color *v;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory;
  Offset<void> test;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> OVar1;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  testarrayofstring;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
  testarrayoftables;
  Offset<MyGame::Example::Monster> OVar2;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testnestedflatbuffer;
  Offset<MyGame::Example::Stat> testempty;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testarrayofbools;
  Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>
  testarrayofsortedstruct;
  Offset<flatbuffers::Vector<double,_unsigned_int>_> vector_of_doubles;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> OVar3;
  Offset<void> any_unique;
  Offset<void> any_ambiguous;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> vector_of_enums;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testrequirednestedflatbuffer;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
  scalar_key_sorted_tables;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t len;
  long lVar4;
  ulong uVar5;
  _VectorArgs _va;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  local_114;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  local_110;
  Offset<MyGame::InParentNamespace> local_10c;
  Offset<flatbuffers::Vector<long,_unsigned_int>_> local_108;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_104;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_100;
  FlatBufferBuilder *local_b0;
  MonsterT *local_a8;
  rehasher_function_t *local_a0;
  unsigned_long local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  unsigned_long local_68;
  uint64_t local_60;
  int64_t local_58;
  uint64_t local_50;
  int64_t local_48;
  ulong local_40;
  Vec3 *local_38;
  
  local_38 = (_o->pos)._M_t.
             super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>
             ._M_t.
             super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
             .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl;
  mana = _o->mana;
  hp = _o->hp;
  local_b0 = _fbb;
  local_a8 = _o;
  local_a0 = _rehasher;
  name = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                   (_fbb,&_o->name);
  uVar5 = 0;
  inventory.o = 0;
  if ((_o->inventory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (_o->inventory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    inventory = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVector<unsigned_char,std::allocator<unsigned_char>>(_fbb,&_o->inventory);
  }
  color = _o->color;
  test_type = (_o->test).type;
  test = AnyUnion::Pack(&_o->test,_fbb,(rehasher_function_t *)0x0);
  if ((_o->test4).super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_o->test4).super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    OVar1 = flatbuffers::FlatBufferBuilderImpl<false>::
            CreateVectorOfStructs<MyGame::Example::Test,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<MyGame::Example::Test>_>
                      (_fbb,&_o->test4);
    uVar5 = (ulong)OVar1.o;
  }
  testarrayoftables.o = 0;
  testarrayofstring.o = 0;
  if ((_o->testarrayofstring).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_o->testarrayofstring).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    testarrayofstring =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (_fbb,&_o->testarrayofstring);
  }
  lVar4 = (long)(_o->testarrayoftables).
                super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->testarrayoftables).
                super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    testarrayoftables =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<flatbuffers::Offset<MyGame::Example::Monster>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,lVar4 >> 3,&local_b0);
  }
  _o_00 = (_o->enemy)._M_t.
          super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
          ._M_t.
          super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
          .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl;
  testnestedflatbuffer.o = 0;
  OVar2.o = 0;
  if (_o_00 != (MonsterT *)0x0) {
    OVar2 = CreateMonster(_fbb,_o_00,_rehasher);
  }
  if ((_o->testnestedflatbuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_o->testnestedflatbuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    testnestedflatbuffer =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_char,std::allocator<unsigned_char>>(_fbb,&_o->testnestedflatbuffer);
  }
  _o_01 = (_o->testempty)._M_t.
          super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
          ._M_t.
          super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
          .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl;
  local_68 = 0;
  testempty.o = 0;
  if (_o_01 != (StatT *)0x0) {
    testempty = CreateStat(_fbb,_o_01,_rehasher);
  }
  testbool = _o->testbool;
  testhashs32_fnv1 = _o->testhashs32_fnv1;
  testhashu32_fnv1 = _o->testhashu32_fnv1;
  local_48 = _o->testhashs64_fnv1;
  local_50 = _o->testhashu64_fnv1;
  testhashs32_fnv1a = _o->testhashs32_fnv1a;
  if (_rehasher != (rehasher_function_t *)0x0) {
    local_68 = std::function<unsigned_long_(void_*)>::operator()(_rehasher,_o->testhashu32_fnv1a);
  }
  local_58 = _o->testhashs64_fnv1a;
  local_60 = _o->testhashu64_fnv1a;
  local_100.o = 0;
  testarrayofbools.o = 0;
  if (((long)(_o->testarrayofbools).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(_o->testarrayofbools).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
      (ulong)(_o->testarrayofbools).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
    testarrayofbools =
         flatbuffers::FlatBufferBuilderImpl<false>::CreateVector(_fbb,&_o->testarrayofbools);
  }
  testf = _o->testf;
  testf2 = _o->testf2;
  testf3 = _o->testf3;
  if ((_o->testarrayofstring2).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_o->testarrayofstring2).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_100 = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          (_fbb,&_o->testarrayofstring2);
  }
  local_104.o = 0;
  testarrayofsortedstruct.o = 0;
  if ((_o->testarrayofsortedstruct).
      super__Vector_base<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_o->testarrayofsortedstruct).
      super__Vector_base<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    testarrayofsortedstruct =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVectorOfStructs<MyGame::Example::Ability,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<MyGame::Example::Ability>_>
                   (_fbb,&_o->testarrayofsortedstruct);
  }
  if ((_o->flex).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (_o->flex).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_104 = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVector<unsigned_char,std::allocator<unsigned_char>>(_fbb,&_o->flex);
  }
  local_108.o = 0;
  OVar1.o = 0;
  if ((_o->test5).super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_o->test5).super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    OVar1 = flatbuffers::FlatBufferBuilderImpl<false>::
            CreateVectorOfStructs<MyGame::Example::Test,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<MyGame::Example::Test>_>
                      (_fbb,&_o->test5);
  }
  if ((_o->vector_of_longs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (_o->vector_of_longs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_108 = flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<long,std::allocator<long>>
                          (_fbb,&_o->vector_of_longs);
  }
  local_10c.o = 0;
  vector_of_doubles.o = 0;
  if ((_o->vector_of_doubles).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (_o->vector_of_doubles).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    vector_of_doubles =
         flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<double,std::allocator<double>>
                   (_fbb,&_o->vector_of_doubles);
  }
  if ((_o->parent_namespace_test)._M_t.
      super___uniq_ptr_impl<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>
      ._M_t.
      super__Tuple_impl<0UL,_MyGame::InParentNamespaceT_*,_std::default_delete<MyGame::InParentNamespaceT>_>
      .super__Head_base<0UL,_MyGame::InParentNamespaceT_*,_false>._M_head_impl !=
      (InParentNamespaceT *)0x0) {
    local_10c = CreateInParentNamespace(_fbb);
  }
  lVar4 = (long)(_o->vector_of_referrables).
                super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->vector_of_referrables).
                super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    local_110.o = 0;
  }
  else {
    local_110 = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVector<flatbuffers::Offset<MyGame::Example::Referrable>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                          (_fbb,lVar4 >> 3,&local_b0);
  }
  local_70 = 0;
  if (_rehasher == (rehasher_function_t *)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = std::function<unsigned_long_(void_*)>::operator()
                         (_rehasher,_o->single_weak_reference);
  }
  lVar4 = (long)(_o->vector_of_weak_references).
                super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->vector_of_weak_references).
                super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    OVar3 = flatbuffers::FlatBufferBuilderImpl<false>::
            CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_3_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                      (_fbb,lVar4 >> 3,&local_b0);
    local_70 = CONCAT44(extraout_var,OVar3.o);
  }
  lVar4 = (long)(_o->vector_of_strong_referrables).
                super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->vector_of_strong_referrables).
                super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    local_114.o = 0;
  }
  else {
    local_114 = flatbuffers::FlatBufferBuilderImpl<false>::
                CreateVector<flatbuffers::Offset<MyGame::Example::Referrable>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_4_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                          (_fbb,lVar4 >> 3,&local_b0);
  }
  local_78 = 0;
  if (_rehasher == (rehasher_function_t *)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = std::function<unsigned_long_(void_*)>::operator()(_rehasher,_o->co_owning_reference);
  }
  lVar4 = (long)(_o->vector_of_co_owning_references).
                super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->vector_of_co_owning_references).
                super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    OVar3 = flatbuffers::FlatBufferBuilderImpl<false>::
            CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_5_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                      (_fbb,lVar4 >> 3,&local_b0);
    local_78 = CONCAT44(extraout_var_00,OVar3.o);
  }
  local_80 = 0;
  if (_rehasher == (rehasher_function_t *)0x0) {
    local_98 = 0;
  }
  else {
    local_98 = std::function<unsigned_long_(void_*)>::operator()(_rehasher,_o->non_owning_reference)
    ;
  }
  lVar4 = (long)(_o->vector_of_non_owning_references).
                super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->vector_of_non_owning_references).
                super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_40 = uVar5;
  if (lVar4 != 0) {
    OVar3 = flatbuffers::FlatBufferBuilderImpl<false>::
            CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_6_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                      (_fbb,lVar4 >> 3,&local_b0);
    local_80 = CONCAT44(extraout_var_01,OVar3.o);
  }
  any_unique_type = (_o->any_unique).type;
  testrequirednestedflatbuffer.o = 0;
  any_unique = AnyUniqueAliasesUnion::Pack(&_o->any_unique,_fbb,(rehasher_function_t *)0x0);
  any_ambiguous_type = (_o->any_ambiguous).type;
  any_ambiguous = AnyAmbiguousAliasesUnion::Pack(&_o->any_ambiguous,_fbb,(rehasher_function_t *)0x0)
  ;
  v = (_o->vector_of_enums).
      super__Vector_base<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>._M_impl.
      super__Vector_impl_data._M_start;
  vector_of_enums.o = 0;
  len = (long)(_o->vector_of_enums).
              super__Vector_base<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)v;
  if (len != 0) {
    vector_of_enums =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVectorScalarCast<unsigned_char,MyGame::Example::Color>(_fbb,v,len);
  }
  signed_enum = _o->signed_enum;
  if ((_o->testrequirednestedflatbuffer).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (_o->testrequirednestedflatbuffer).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    testrequirednestedflatbuffer =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_char,std::allocator<unsigned_char>>
                   (_fbb,&_o->testrequirednestedflatbuffer);
  }
  lVar4 = (long)(_o->scalar_key_sorted_tables).
                super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->scalar_key_sorted_tables).
                super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    scalar_key_sorted_tables.o = 0;
  }
  else {
    scalar_key_sorted_tables =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<flatbuffers::Offset<MyGame::Example::Stat>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_7_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,lVar4 >> 3,&local_b0);
  }
  OVar2 = CreateMonster(_fbb,local_38,mana,hp,name,inventory,color,test_type,test,
                        (offset_type)local_40,testarrayofstring,testarrayoftables,OVar2,
                        testnestedflatbuffer,testempty,testbool,testhashs32_fnv1,testhashu32_fnv1,
                        local_48,local_50,testhashs32_fnv1a,(uint32_t)local_68,local_58,local_60,
                        testarrayofbools,testf,testf2,testf3,local_100,testarrayofsortedstruct,
                        local_104,OVar1,local_108,vector_of_doubles,local_10c,local_110,local_88,
                        (offset_type)local_70,local_114,local_90,(offset_type)local_78,local_98,
                        (offset_type)local_80,any_unique_type,any_unique,any_ambiguous_type,
                        any_ambiguous,vector_of_enums,signed_enum,testrequirednestedflatbuffer,
                        scalar_key_sorted_tables,&_o->native_inline,_o->long_enum_non_enum_default,
                        _o->long_enum_normal_default,_o->nan_default,_o->inf_default,
                        _o->positive_inf_default,_o->infinity_default,_o->positive_infinity_default,
                        _o->negative_inf_default,_o->negative_infinity_default,
                        _o->double_inf_default);
  return (Offset<MyGame::Example::Monster>)OVar2.o;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(::flatbuffers::FlatBufferBuilder &_fbb, const MonsterT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const MonsterT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _pos = _o->pos ? _o->pos.get() : nullptr;
  auto _mana = _o->mana;
  auto _hp = _o->hp;
  auto _name = _fbb.CreateString(_o->name);
  auto _inventory = _o->inventory.size() ? _fbb.CreateVector(_o->inventory) : 0;
  auto _color = _o->color;
  auto _test_type = _o->test.type;
  auto _test = _o->test.Pack(_fbb);
  auto _test4 = _o->test4.size() ? _fbb.CreateVectorOfStructs(_o->test4) : 0;
  auto _testarrayofstring = _o->testarrayofstring.size() ? _fbb.CreateVectorOfStrings(_o->testarrayofstring) : 0;
  auto _testarrayoftables = _o->testarrayoftables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Monster>> (_o->testarrayoftables.size(), [](size_t i, _VectorArgs *__va) { return CreateMonster(*__va->__fbb, __va->__o->testarrayoftables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _enemy = _o->enemy ? CreateMonster(_fbb, _o->enemy.get(), _rehasher) : 0;
  auto _testnestedflatbuffer = _o->testnestedflatbuffer.size() ? _fbb.CreateVector(_o->testnestedflatbuffer) : 0;
  auto _testempty = _o->testempty ? CreateStat(_fbb, _o->testempty.get(), _rehasher) : 0;
  auto _testbool = _o->testbool;
  auto _testhashs32_fnv1 = _o->testhashs32_fnv1;
  auto _testhashu32_fnv1 = _o->testhashu32_fnv1;
  auto _testhashs64_fnv1 = _o->testhashs64_fnv1;
  auto _testhashu64_fnv1 = _o->testhashu64_fnv1;
  auto _testhashs32_fnv1a = _o->testhashs32_fnv1a;
  auto _testhashu32_fnv1a = _rehasher ? static_cast<uint32_t>((*_rehasher)(_o->testhashu32_fnv1a)) : 0;
  auto _testhashs64_fnv1a = _o->testhashs64_fnv1a;
  auto _testhashu64_fnv1a = _o->testhashu64_fnv1a;
  auto _testarrayofbools = _o->testarrayofbools.size() ? _fbb.CreateVector(_o->testarrayofbools) : 0;
  auto _testf = _o->testf;
  auto _testf2 = _o->testf2;
  auto _testf3 = _o->testf3;
  auto _testarrayofstring2 = _o->testarrayofstring2.size() ? _fbb.CreateVectorOfStrings(_o->testarrayofstring2) : 0;
  auto _testarrayofsortedstruct = _o->testarrayofsortedstruct.size() ? _fbb.CreateVectorOfStructs(_o->testarrayofsortedstruct) : 0;
  auto _flex = _o->flex.size() ? _fbb.CreateVector(_o->flex) : 0;
  auto _test5 = _o->test5.size() ? _fbb.CreateVectorOfStructs(_o->test5) : 0;
  auto _vector_of_longs = _o->vector_of_longs.size() ? _fbb.CreateVector(_o->vector_of_longs) : 0;
  auto _vector_of_doubles = _o->vector_of_doubles.size() ? _fbb.CreateVector(_o->vector_of_doubles) : 0;
  auto _parent_namespace_test = _o->parent_namespace_test ? CreateInParentNamespace(_fbb, _o->parent_namespace_test.get(), _rehasher) : 0;
  auto _vector_of_referrables = _o->vector_of_referrables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Referrable>> (_o->vector_of_referrables.size(), [](size_t i, _VectorArgs *__va) { return CreateReferrable(*__va->__fbb, __va->__o->vector_of_referrables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _single_weak_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->single_weak_reference)) : 0;
  auto _vector_of_weak_references = _o->vector_of_weak_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_weak_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_weak_references[i])) : 0; }, &_va ) : 0;
  auto _vector_of_strong_referrables = _o->vector_of_strong_referrables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Referrable>> (_o->vector_of_strong_referrables.size(), [](size_t i, _VectorArgs *__va) { return CreateReferrable(*__va->__fbb, __va->__o->vector_of_strong_referrables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _co_owning_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->co_owning_reference)) : 0;
  auto _vector_of_co_owning_references = _o->vector_of_co_owning_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_co_owning_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_co_owning_references[i].get())) : 0; }, &_va ) : 0;
  auto _non_owning_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->non_owning_reference)) : 0;
  auto _vector_of_non_owning_references = _o->vector_of_non_owning_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_non_owning_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_non_owning_references[i])) : 0; }, &_va ) : 0;
  auto _any_unique_type = _o->any_unique.type;
  auto _any_unique = _o->any_unique.Pack(_fbb);
  auto _any_ambiguous_type = _o->any_ambiguous.type;
  auto _any_ambiguous = _o->any_ambiguous.Pack(_fbb);
  auto _vector_of_enums = _o->vector_of_enums.size() ? _fbb.CreateVectorScalarCast<uint8_t>(::flatbuffers::data(_o->vector_of_enums), _o->vector_of_enums.size()) : 0;
  auto _signed_enum = _o->signed_enum;
  auto _testrequirednestedflatbuffer = _o->testrequirednestedflatbuffer.size() ? _fbb.CreateVector(_o->testrequirednestedflatbuffer) : 0;
  auto _scalar_key_sorted_tables = _o->scalar_key_sorted_tables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Stat>> (_o->scalar_key_sorted_tables.size(), [](size_t i, _VectorArgs *__va) { return CreateStat(*__va->__fbb, __va->__o->scalar_key_sorted_tables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _native_inline = &_o->native_inline;
  auto _long_enum_non_enum_default = _o->long_enum_non_enum_default;
  auto _long_enum_normal_default = _o->long_enum_normal_default;
  auto _nan_default = _o->nan_default;
  auto _inf_default = _o->inf_default;
  auto _positive_inf_default = _o->positive_inf_default;
  auto _infinity_default = _o->infinity_default;
  auto _positive_infinity_default = _o->positive_infinity_default;
  auto _negative_inf_default = _o->negative_inf_default;
  auto _negative_infinity_default = _o->negative_infinity_default;
  auto _double_inf_default = _o->double_inf_default;
  return MyGame::Example::CreateMonster(
      _fbb,
      _pos,
      _mana,
      _hp,
      _name,
      _inventory,
      _color,
      _test_type,
      _test,
      _test4,
      _testarrayofstring,
      _testarrayoftables,
      _enemy,
      _testnestedflatbuffer,
      _testempty,
      _testbool,
      _testhashs32_fnv1,
      _testhashu32_fnv1,
      _testhashs64_fnv1,
      _testhashu64_fnv1,
      _testhashs32_fnv1a,
      _testhashu32_fnv1a,
      _testhashs64_fnv1a,
      _testhashu64_fnv1a,
      _testarrayofbools,
      _testf,
      _testf2,
      _testf3,
      _testarrayofstring2,
      _testarrayofsortedstruct,
      _flex,
      _test5,
      _vector_of_longs,
      _vector_of_doubles,
      _parent_namespace_test,
      _vector_of_referrables,
      _single_weak_reference,
      _vector_of_weak_references,
      _vector_of_strong_referrables,
      _co_owning_reference,
      _vector_of_co_owning_references,
      _non_owning_reference,
      _vector_of_non_owning_references,
      _any_unique_type,
      _any_unique,
      _any_ambiguous_type,
      _any_ambiguous,
      _vector_of_enums,
      _signed_enum,
      _testrequirednestedflatbuffer,
      _scalar_key_sorted_tables,
      _native_inline,
      _long_enum_non_enum_default,
      _long_enum_normal_default,
      _nan_default,
      _inf_default,
      _positive_inf_default,
      _infinity_default,
      _positive_infinity_default,
      _negative_inf_default,
      _negative_infinity_default,
      _double_inf_default);
}